

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_1::AssertionPrinter::printOriginalExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  string local_30;
  
  if ((this->result->m_info).capturedExpression.m_size != 0) {
    poVar1 = std::operator<<((ostream *)this->stream,' ');
    AssertionResult::getExpression_abi_cxx11_(&local_30,this->result);
    std::operator<<(poVar1,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void printOriginalExpression() const {
        if (result.hasExpression()) {
            stream << ' ' << result.getExpression();
        }
    }